

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O3

void __thiscall QFormLayoutPrivate::setupHorizontalLayoutData(QFormLayoutPrivate *this,int width)

{
  char cVar1;
  long lVar2;
  long lVar3;
  RowWrapPolicy RVar4;
  pointer ppQVar5;
  int iVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  
  uVar13 = (this->m_matrix).m_storage.d.size;
  RVar4 = QFormLayout::rowWrapPolicy(*(QFormLayout **)&(this->super_QLayoutPrivate).field_0x8);
  uVar12 = (uint)(uVar13 >> 1);
  if ((int)uVar12 < 1) {
    iVar9 = 0;
  }
  else {
    uVar13 = (ulong)(uVar12 & 0x7fffffff);
    lVar14 = 0;
    iVar9 = 0;
    do {
      ppQVar5 = QList<QFormLayoutItem_*>::data(&(this->m_matrix).m_storage);
      lVar2 = *(long *)((long)ppQVar5 + lVar14);
      ppQVar5 = QList<QFormLayoutItem_*>::data(&(this->m_matrix).m_storage);
      lVar3 = *(long *)((long)ppQVar5 + lVar14 + 8);
      if (lVar2 != 0 || lVar3 != 0) {
        if (lVar2 != 0) {
          if ((lVar3 == 0) || (piVar7 = &this->maxLabelWidth, *(char *)(lVar2 + 0x2c) == '\0')) {
            piVar7 = (int *)(lVar2 + 0x14);
          }
          *(int *)(lVar2 + 0x38) = *piVar7;
          *(undefined4 *)(lVar2 + 0x34) = 0;
        }
        if (lVar3 != 0) {
          iVar6 = *(int *)(lVar3 + 0x24) + this->maxLabelWidth;
          iVar8 = width - iVar6;
          cVar1 = *(char *)(lVar3 + 0x2c);
          iVar10 = width;
          if (cVar1 != '\0') {
            iVar10 = iVar8;
          }
          iVar11 = 0;
          if (cVar1 != '\0') {
            iVar11 = iVar6;
          }
          if ((((RVar4 != WrapAllRows) && (cVar1 == '\0')) &&
              ((lVar2 != 0 || (iVar11 = 0, iVar10 = width, *(char *)(lVar3 + 8) == '\0')))) &&
             (iVar11 = iVar6, iVar10 = iVar8, iVar8 < *(int *)(lVar3 + 0x14))) {
            iVar11 = 0;
            iVar10 = width;
          }
          *(int *)(lVar3 + 0x38) = iVar10;
          *(int *)(lVar3 + 0x34) = iVar11;
          if (iVar9 <= *(int *)(lVar3 + 0x1c)) {
            iVar9 = *(int *)(lVar3 + 0x1c);
          }
        }
      }
      lVar14 = lVar14 + 0x10;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
  this->formMaxWidth = iVar9 + this->maxLabelWidth;
  return;
}

Assistant:

void QFormLayoutPrivate::setupHorizontalLayoutData(int width)
{
    Q_Q(QFormLayout);

    // requires setupVerticalLayoutData to be called first

    int fieldMaxWidth = 0;

    int rr = m_matrix.rowCount();
    bool wrapAllRows = (q->rowWrapPolicy() == QFormLayout::WrapAllRows);

    for (int i = 0; i < rr; ++i) {
        QFormLayoutItem *label = m_matrix(i, 0);
        QFormLayoutItem *field = m_matrix(i, 1);

        // Totally ignore empty rows...
        if (!label && !field)
            continue;

        if (label) {
            // if there is a field, and we're side by side, we use maxLabelWidth
            // otherwise we just use the sizehint
            label->layoutWidth = (field && label->sideBySide) ? maxLabelWidth : label->sizeHint.width();
            label->layoutPos = 0;
        }

        if (field) {
            // This is the default amount allotted to fields in sbs
            int fldwidth = width - maxLabelWidth - field->sbsHSpace;

            // If we've split a row, we still decide to align
            // the field with all the other field if it will fit
            // Fields in sbs mode get the remnants of the maxLabelWidth
            if (!field->sideBySide) {
                if (wrapAllRows || (!label && field->fullRow) || field->sizeHint.width() > fldwidth) {
                    field->layoutWidth = width;
                    field->layoutPos = 0;
                } else {
                    field->layoutWidth = fldwidth;
                    field->layoutPos = width - fldwidth;
                }
            } else {
                // We're sbs, so we should have a label
                field->layoutWidth = fldwidth;
                field->layoutPos = width - fldwidth;
            }

            fieldMaxWidth = qMax(fieldMaxWidth, field->maxSize.width());
        }
    }

    formMaxWidth = maxLabelWidth + fieldMaxWidth;
}